

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::throwErrorIfNotReadableType(Expression *e)

{
  int iVar1;
  long lVar2;
  Context *this;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if (e->kind == type) {
    iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])(e);
    if ((char)iVar1 != '\0') {
      return;
    }
  }
  lVar2 = __dynamic_cast(e,&AST::Expression::typeinfo,&AST::ProcessorRef::typeinfo,0);
  this = &(e->super_Statement).super_ASTObject.context;
  if (lVar2 == 0) {
    CompileMessageHelpers::createMessage<>(&local_80,syntax,error,"Expected a type");
    AST::Context::throwError(this,&local_80,false);
  }
  CompileMessageHelpers::createMessage<>
            (&local_48,syntax,error,"Cannot use a processor name as a type");
  AST::Context::throwError(this,&local_48,false);
}

Assistant:

static void throwErrorIfNotReadableType (AST::Expression& e)
    {
        if (! AST::isResolvedAsType (e))
        {
            if (is_type<AST::ProcessorRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsType());

            e.context.throwError (Errors::expectedType());
        }
    }